

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCall3(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,bool allowFailure,bool allowInternal,
                   bool allowFastLookup)

{
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  ArgumentData local_108;
  SmallArray<ArgumentData,_3U> arguments;
  
  SmallArray<ArgumentData,_3U>::SmallArray(&arguments,ctx->allocator);
  local_108.source = arg0->source;
  local_108.type = arg0->type;
  local_108.isExplicit = false;
  local_108.name = (SynIdentifier *)0x0;
  local_108.valueFunction = (FunctionData *)0x0;
  local_108.value = arg0;
  SmallArray<ArgumentData,_3U>::push_back(&arguments,&local_108);
  local_108.source = arg1->source;
  local_108.type = arg1->type;
  local_108.isExplicit = false;
  local_108.name = (SynIdentifier *)0x0;
  local_108.valueFunction = (FunctionData *)0x0;
  local_108.value = arg1;
  SmallArray<ArgumentData,_3U>::push_back(&arguments,&local_108);
  local_108.source = arg2->source;
  local_108.type = arg2->type;
  local_108.isExplicit = false;
  local_108.name = (SynIdentifier *)0x0;
  local_108.value = arg2;
  local_108.valueFunction = (FunctionData *)0x0;
  SmallArray<ArgumentData,_3U>::push_back(&arguments,&local_108);
  arguments_00._12_4_ = 0;
  arguments_00.data = arguments.data;
  arguments_00.count = arguments.count;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name,arguments_00,allowFailure,allowInternal,allowFastLookup);
  SmallArray<ArgumentData,_3U>::~SmallArray(&arguments);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall3(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 3> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}